

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FileDescriptor *file)

{
  long lVar1;
  string local_50;
  string basename;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x80) & 2) == 0) {
    basename._M_dataplus._M_p = (pointer)&basename.field_2;
    basename._M_string_length = 0;
    basename.field_2._M_local_buf[0] = '\0';
    lVar1 = std::__cxx11::string::rfind((char)*(undefined8 *)this,0x2f);
    if (lVar1 == -1) {
      std::__cxx11::string::_M_assign((string *)&basename);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,*(ulong *)this);
      std::__cxx11::string::operator=((string *)&basename,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    StripProto(&local_50,&basename);
    anon_unknown_0::UnderscoresToCamelCaseImpl(__return_storage_ptr__,&local_50,true);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&basename);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,*(string **)(*(long *)(this + 0x88) + 0x48));
  }
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const FileDescriptor* file) {
  if (file->options().has_java_outer_classname()) {
    return file->options().java_outer_classname();
  } else {
    string basename;
    string::size_type last_slash = file->name().find_last_of('/');
    if (last_slash == string::npos) {
      basename = file->name();
    } else {
      basename = file->name().substr(last_slash + 1);
    }
    return UnderscoresToCamelCaseImpl(StripProto(basename), true);
  }
}